

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS
ref_interp_locate_between(REF_INTERP ref_interp,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LIST ref_list;
  uint local_a8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  uint local_88;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  long lStack_68;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT local_50;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT id;
  REF_INT i;
  REF_AGENTS ref_agents;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_INT local_20;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_INTERP ref_interp_local;
  
  ref_grid._4_4_ = new_node;
  local_20 = node1;
  new_node_local = node0;
  _node1_local = ref_interp;
  if (ref_interp == (REF_INTERP)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x7a4,
           "ref_interp_locate_between","ref_interp NULL");
    ref_interp_local._4_4_ = 2;
  }
  else {
    ref_agents = (REF_AGENTS)ref_interp->ref_mpi;
    ref_node = (REF_NODE)ref_interp->to_grid;
    ref_mpi = (REF_MPI)((REF_GRID)ref_node)->node;
    if (ref_interp->max <= new_node) {
      ref_private_status_reis_ai._4_4_ = ref_interp_resize(ref_interp,((REF_NODE)ref_mpi)->max);
      if (ref_private_status_reis_ai._4_4_ != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x7aa,"ref_interp_locate_between",(ulong)ref_private_status_reis_ai._4_4_,"resize");
        return ref_private_status_reis_ai._4_4_;
      }
      ref_private_status_reis_ai._4_4_ = 0;
    }
    _node1_local->cell[ref_grid._4_4_] = -1;
    _id = _node1_local->ref_agents;
    ref_private_status_reis_bi = 0;
    lStack_68 = (long)_id->n;
    if (lStack_68 == 0) {
      local_50 = -1;
      if (((new_node_local != -1) && (_node1_local->cell[new_node_local] != -1)) &&
         (ref_agents->max == _node1_local->part[new_node_local])) {
        _node1_local->agent_hired[ref_grid._4_4_] = 1;
        ref_private_status_reis_ai_1._4_4_ =
             ref_agents_push(_id,ref_grid._4_4_,_node1_local->part[new_node_local],
                             _node1_local->cell[new_node_local],
                             (REF_DBL *)(*(long *)(ref_mpi + 1) + (long)(ref_grid._4_4_ * 0xf) * 8),
                             &local_50);
        if (ref_private_status_reis_ai_1._4_4_ != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7ba,"ref_interp_locate_between",(ulong)ref_private_status_reis_ai_1._4_4_,
                 "requeue");
          return ref_private_status_reis_ai_1._4_4_;
        }
        ref_private_status_reis_bi_1 = 1;
        _ref_private_macro_code_rss_3 = (ulong)_id->agent[local_50].mode;
        if (_ref_private_macro_code_rss_3 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7bb,"ref_interp_locate_between","not walking?",1,_ref_private_macro_code_rss_3);
          return 1;
        }
        ref_private_macro_code_rss_4 = ref_interp_walk_agent(_node1_local,local_50);
        if (ref_private_macro_code_rss_4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7bc,"ref_interp_locate_between",(ulong)(uint)ref_private_macro_code_rss_4,
                 "walking");
          return ref_private_macro_code_rss_4;
        }
        if (_id->agent[local_50].mode != REF_AGENT_ENCLOSING) {
          _node1_local->agent_hired[ref_grid._4_4_] = 0;
          local_88 = ref_agents_remove(_id,local_50);
          if (local_88 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x7bf,"ref_interp_locate_between",(ulong)local_88,"no longer needed");
            return local_88;
          }
          local_50 = -1;
          local_88 = 0;
        }
      }
      if (((local_50 == -1) && (local_20 != -1)) &&
         ((_node1_local->cell[local_20] != -1 && (ref_agents->max == _node1_local->part[local_20])))
         ) {
        _node1_local->agent_hired[ref_grid._4_4_] = 1;
        ref_private_status_reis_ai_2._4_4_ =
             ref_agents_push(_id,ref_grid._4_4_,_node1_local->part[local_20],
                             _node1_local->cell[local_20],
                             (REF_DBL *)(*(long *)(ref_mpi + 1) + (long)(ref_grid._4_4_ * 0xf) * 8),
                             &local_50);
        if (ref_private_status_reis_ai_2._4_4_ != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7cb,"ref_interp_locate_between",(ulong)ref_private_status_reis_ai_2._4_4_,
                 "requeue");
          return ref_private_status_reis_ai_2._4_4_;
        }
        ref_private_status_reis_bi_2 = 1;
        _ref_private_macro_code_rss_6 = (ulong)_id->agent[local_50].mode;
        if (_ref_private_macro_code_rss_6 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7cc,"ref_interp_locate_between","not walking?",1,_ref_private_macro_code_rss_6);
          return 1;
        }
        ref_private_macro_code_rss_7 = ref_interp_walk_agent(_node1_local,local_50);
        if (ref_private_macro_code_rss_7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7cd,"ref_interp_locate_between",(ulong)(uint)ref_private_macro_code_rss_7,
                 "walking");
          return ref_private_macro_code_rss_7;
        }
        if (_id->agent[local_50].mode != REF_AGENT_ENCLOSING) {
          _node1_local->agent_hired[ref_grid._4_4_] = 0;
          local_a8 = ref_agents_remove(_id,local_50);
          if (local_a8 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,2000,"ref_interp_locate_between",(ulong)local_a8,"no longer needed");
            return local_a8;
          }
          local_50 = -1;
          local_a8 = 0;
        }
      }
      if (local_50 != -1) {
        if (_id->agent[local_50].mode == REF_AGENT_ENCLOSING) {
          _node1_local->cell[ref_grid._4_4_] = _id->agent[local_50].seed;
          _node1_local->part[ref_grid._4_4_] = _id->agent[local_50].part;
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 4;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            _node1_local->bary[ref_private_macro_code_rss + ref_grid._4_4_ * 4] =
                 _id->agent[local_50].bary[ref_private_macro_code_rss];
          }
          _node1_local->walk_steps = _id->agent[local_50].step + 1 + _node1_local->walk_steps;
          _node1_local->n_walk = _node1_local->n_walk + 1;
        }
        else {
          _node1_local->cell[ref_grid._4_4_] = -1;
        }
        _node1_local->agent_hired[ref_grid._4_4_] = 0;
        ref_list._4_4_ = ref_agents_remove(_id,local_50);
        if (ref_list._4_4_ != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7e3,"ref_interp_locate_between",(ulong)ref_list._4_4_,"no longer needed");
          return ref_list._4_4_;
        }
        ref_list._4_4_ = 0;
      }
      if ((ref_agents->n < 2) && (_node1_local->cell[ref_grid._4_4_] == -1)) {
        uVar1 = ref_list_create((REF_LIST *)&ref_private_macro_code_rss_9);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7e9,"ref_interp_locate_between",(ulong)uVar1,"create list");
          return uVar1;
        }
        uVar1 = ref_search_touching(_node1_local->ref_search,_ref_private_macro_code_rss_9,
                                    (REF_DBL *)
                                    (*(long *)(ref_mpi + 1) + (long)(ref_grid._4_4_ * 0xf) * 8),
                                    _node1_local->search_fuzz);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7ed,"ref_interp_locate_between",(ulong)uVar1,"tch");
          return uVar1;
        }
        if (0 < _ref_private_macro_code_rss_9->n) {
          if (_node1_local->from_grid->twod == 0) {
            uVar1 = ref_interp_enclosing_tet_in_list
                              (_node1_local,_ref_private_macro_code_rss_9,
                               (REF_DBL *)
                               (*(long *)(ref_mpi + 1) + (long)(ref_grid._4_4_ * 0xf) * 8),
                               _node1_local->cell + ref_grid._4_4_,
                               _node1_local->bary + (ref_grid._4_4_ << 2));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x7fa,"ref_interp_locate_between",(ulong)uVar1,"best in list");
              return uVar1;
            }
          }
          else {
            uVar1 = ref_interp_enclosing_tri_in_list
                              (_node1_local,_ref_private_macro_code_rss_9,
                               (REF_DBL *)
                               (*(long *)(ref_mpi + 1) + (long)(ref_grid._4_4_ * 0xf) * 8),
                               _node1_local->cell + ref_grid._4_4_,
                               _node1_local->bary + (ref_grid._4_4_ << 2));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x7f4,"ref_interp_locate_between",(ulong)uVar1,"best in list");
              return uVar1;
            }
          }
        }
        uVar1 = ref_list_free(_ref_private_macro_code_rss_9);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x7fd,"ref_interp_locate_between",(ulong)uVar1,"free list");
          return uVar1;
        }
      }
      ref_interp_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x7af,"ref_interp_locate_between","did not expect active agents",0,lStack_68);
      ref_interp_local._4_4_ = 1;
    }
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_between(REF_INTERP ref_interp,
                                             REF_INT node0, REF_INT node1,
                                             REF_INT new_node) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_AGENTS ref_agents;
  REF_INT i, id;
  RNS(ref_interp, "ref_interp NULL");

  ref_mpi = ref_interp_mpi(ref_interp);
  ref_grid = ref_interp_to_grid(ref_interp);
  ref_node = ref_grid_node(ref_grid);
  if (new_node >= ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, ref_node_max(ref_node)), "resize");
  }
  ref_interp->cell[new_node] = REF_EMPTY; /* initialize new_node locate */

  ref_agents = ref_interp->ref_agents;
  REIS(0, ref_agents_n(ref_agents), "did not expect active agents");

  id = REF_EMPTY;

  if (id == REF_EMPTY && node0 != REF_EMPTY &&
      REF_EMPTY != ref_interp->cell[node0] &&
      ref_mpi_rank(ref_mpi) == ref_interp->part[node0]) {
    ref_interp->agent_hired[new_node] = REF_TRUE;
    RSS(ref_agents_push(ref_agents, new_node, ref_interp->part[node0],
                        ref_interp->cell[node0],
                        ref_node_xyz_ptr(ref_node, new_node), &id),
        "requeue");
    REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "not walking?");
    RSS(ref_interp_walk_agent(ref_interp, id), "walking");
    if (REF_AGENT_ENCLOSING != ref_agent_mode(ref_agents, id)) {
      ref_interp->agent_hired[new_node] = REF_FALSE; /* dismissed */
      RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      id = REF_EMPTY;
    }
  }

  if (id == REF_EMPTY && node1 != REF_EMPTY &&
      REF_EMPTY != ref_interp->cell[node1] &&
      ref_mpi_rank(ref_mpi) == ref_interp->part[node1]) {
    ref_interp->agent_hired[new_node] = REF_TRUE;
    RSS(ref_agents_push(ref_agents, new_node, ref_interp->part[node1],
                        ref_interp->cell[node1],
                        ref_node_xyz_ptr(ref_node, new_node), &id),
        "requeue");
    REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "not walking?");
    RSS(ref_interp_walk_agent(ref_interp, id), "walking");
    if (REF_AGENT_ENCLOSING != ref_agent_mode(ref_agents, id)) {
      ref_interp->agent_hired[new_node] = REF_FALSE; /* dismissed */
      RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      id = REF_EMPTY;
    }
  }

  if (id != REF_EMPTY) {
    if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id)) {
      ref_interp->cell[new_node] = ref_agent_seed(ref_agents, id);
      ref_interp->part[new_node] = ref_agent_part(ref_agents, id);
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * new_node] = ref_agent_bary(ref_agents, i, id);
      (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
      (ref_interp->n_walk)++;
    } else {
      /* new seed or go exhaustive for REF_AGENT_AT_BOUNDARY */
      /* what for parallel REF_AGENT_HOP_PART */
      ref_interp->cell[new_node] = REF_EMPTY;
    }
    ref_interp->agent_hired[new_node] = REF_FALSE; /* dismissed */
    RSS(ref_agents_remove(ref_agents, id), "no longer needed");
  }

  if (!ref_mpi_para(ref_mpi) && REF_EMPTY == ref_interp->cell[new_node]) {
    REF_LIST ref_list;

    RSS(ref_list_create(&ref_list), "create list");
    RSS(ref_search_touching(ref_interp_search(ref_interp), ref_list,
                            ref_node_xyz_ptr(ref_node, new_node),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
        RSS(ref_interp_enclosing_tri_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, new_node),
                &(ref_interp->cell[new_node]),
                &(ref_interp->bary[4 * new_node])),
            "best in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, new_node),
                &(ref_interp->cell[new_node]),
                &(ref_interp->bary[4 * new_node])),
            "best in list");
      }
    }
    RSS(ref_list_free(ref_list), "free list");
  }

  return REF_SUCCESS;
}